

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calibrate.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  pointer pbVar1;
  char *pcVar2;
  char cVar3;
  ostream *poVar4;
  FileStorage *pFVar5;
  undefined8 uVar6;
  int y;
  int iVar7;
  int x;
  int iVar8;
  pointer pbVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fns;
  string fp_images;
  vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  vpts2d;
  string fn_params;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
  vpts3d;
  vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> tmp;
  FileStorage fs;
  vector<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_> tvecs;
  vector<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_> rvecs;
  WriteStructContext ws;
  Mat dis_cef;
  Mat cam_mtx;
  ulong *local_2e0;
  Mat *local_2d8;
  ulong auStack_2d0 [2];
  float local_2bc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  long *local_298;
  char *local_290;
  long local_288 [2];
  vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  local_278;
  long *local_258;
  string *local_250;
  long alStack_248 [2];
  long *local_238 [2];
  long local_228 [2];
  vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
  local_218;
  value_type local_1f8;
  undefined8 local_1e0;
  float local_1d8 [2];
  string *local_1d0;
  undefined8 local_1c8;
  void *local_198;
  undefined8 uStack_190;
  long local_188;
  void *local_178;
  undefined8 uStack_170;
  long local_168;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined4 local_148 [2];
  Mat *local_140;
  undefined8 uStack_138;
  int local_130;
  int local_12c;
  void *local_128;
  undefined8 uStack_120;
  long local_118;
  float local_c0 [16];
  int *local_80;
  undefined4 local_60;
  void **local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  void **local_40;
  undefined8 uStack_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "0. Calibrate: input some images then get camera intrinsic params.",0x41);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"../images","");
  pcVar2 = local_290;
  if (1 < argc) {
    __s = argv[1];
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_298,0,pcVar2,(ulong)__s);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"image folder: ",0xe);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_298,(long)local_290);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238[0] = local_228;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_238,local_298,local_290 + (long)local_298);
  std::__cxx11::string::append((char *)local_238);
  cv::glob(local_238,&local_2b8,0);
  if (local_238[0] != local_228) {
    operator_delete(local_238[0],local_228[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"num of images: ",0xf);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if ((ulong)((long)local_2b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_2b8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x41) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"too few images, abort",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
    goto LAB_00102d5d;
  }
  local_1f8.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar7 = 0;
  do {
    local_2bc = (float)iVar7 * 50.0;
    iVar8 = 0;
    do {
      local_c0[0] = (float)iVar8 * 50.0;
      local_128 = (void *)CONCAT44(local_128._4_4_,local_2bc);
      local_1d8[0] = 0.0;
      std::vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>>::
      emplace_back<float,float,float>
                ((vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>> *)&local_1f8,
                 local_c0,(float *)&local_128,local_1d8);
      pbVar1 = local_2b8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      iVar8 = iVar8 + 1;
    } while (iVar8 != 9);
    iVar7 = iVar7 + 1;
  } while (iVar7 != 6);
  local_278.
  super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.
  super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278.
  super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar8 = 0;
  local_218.
  super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218.
  super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.
  super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar7 = 0;
  if (local_2b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar7 = 0;
    iVar8 = 0;
    pbVar9 = local_2b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      cv::imread((string *)local_c0,(int)pbVar9);
      cVar3 = cv::Mat::empty();
      if (cVar3 == '\0') {
        iVar7 = *local_80;
        iVar8 = local_80[1];
        local_118 = 0;
        local_128 = (void *)0x0;
        uStack_120 = 0;
        local_1c8 = 0;
        local_1d8[0] = 2.3693558e-38;
        local_1e0 = 0x600000009;
        auStack_2d0[0] = 0;
        local_2e0 = (ulong *)CONCAT44(local_2e0._4_4_,0x8203000d);
        local_2d8 = (Mat *)&local_128;
        local_1d0 = (string *)local_c0;
        cVar3 = cv::findChessboardCorners(local_1d8,&local_1e0,&local_2e0,3);
        if (cVar3 != '\0') {
          std::
          vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
          ::push_back(&local_278,(value_type *)&local_128);
          std::
          vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
          ::push_back(&local_218,&local_1f8);
        }
        if (local_128 != (void *)0x0) {
          operator_delete(local_128,local_118 - (long)local_128);
        }
      }
      cv::Mat::~Mat((Mat *)local_c0);
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != pbVar1);
  }
  if ((ulong)(((long)local_278.
                     super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_278.
                     super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"too few valid images, abort",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
  }
  else {
    cv::Mat::Mat((Mat *)local_c0);
    cv::Mat::Mat((Mat *)&local_128);
    local_40 = &local_178;
    local_168 = 0;
    local_178 = (void *)0x0;
    uStack_170 = 0;
    local_58 = &local_198;
    local_188 = 0;
    local_198 = (void *)0x0;
    uStack_190 = 0;
    local_1c8 = 0;
    local_1d8[0] = -2.424463e-38;
    local_1d0 = (string *)&local_218;
    auStack_2d0[0] = 0;
    local_2e0 = (ulong *)CONCAT44(local_2e0._4_4_,0x8104000d);
    local_2d8 = (Mat *)&local_278;
    alStack_248[0] = 0;
    local_258 = (long *)CONCAT44(local_258._4_4_,0x3010000);
    uStack_138 = 0;
    local_148[0] = 0x3010000;
    uStack_38 = 0;
    local_48 = 0x82030016;
    uStack_50 = 0;
    local_60 = 0x82030016;
    local_158 = 0x1e00000003;
    uStack_150 = 0x3cb0000000000000;
    local_250 = (string *)local_c0;
    local_140 = (Mat *)&local_128;
    local_130 = iVar8;
    local_12c = iVar7;
    cv::calibrateCamera();
    cv::FileStorage::FileStorage((FileStorage *)local_1d8);
    local_258 = alStack_248;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"params.json","");
    local_2d8 = (Mat *)0x0;
    auStack_2d0[0] = auStack_2d0[0] & 0xffffffffffffff00;
    local_2e0 = auStack_2d0;
    cVar3 = cv::FileStorage::open((string *)local_1d8,(int)&local_258,(string *)0x1);
    if (local_2e0 != auStack_2d0) {
      operator_delete(local_2e0,auStack_2d0[0] + 1);
    }
    if (cVar3 != '\0') {
      local_2e0 = auStack_2d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"cam_mtx","");
      pFVar5 = (FileStorage *)cv::operator<<((FileStorage *)local_1d8,(string *)&local_2e0);
      if (local_2e0 != auStack_2d0) {
        operator_delete(local_2e0,auStack_2d0[0] + 1);
      }
      cVar3 = (**(code **)(*(long *)pFVar5 + 0x18))(pFVar5);
      if (cVar3 != '\0') {
        if (*(int *)(pFVar5 + 8) != 6) {
          cv::write(pFVar5,(string *)(pFVar5 + 0x10),(Mat *)local_c0);
          if (((byte)pFVar5[8] & 4) != 0) {
            *(undefined4 *)(pFVar5 + 8) = 6;
          }
          goto LAB_00102ae1;
        }
        local_2e0 = auStack_2d0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2e0,"No element name has been given","");
        cv::error(-2,(string *)&local_2e0,"operator<<",
                  "/usr/include/opencv4/opencv2/core/persistence.hpp",0x4c8);
LAB_00102dd3:
        local_2e0 = auStack_2d0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2e0,"No element name has been given","");
        cv::error(-2,(string *)&local_2e0,"operator<<",
                  "/usr/include/opencv4/opencv2/core/persistence.hpp",0x4c8);
LAB_00102e11:
        local_2e0 = auStack_2d0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2e0,"No element name has been given","");
        uVar6 = cv::error(-2,(string *)&local_2e0,"operator<<",
                          "/usr/include/opencv4/opencv2/core/persistence.hpp",0x4c8);
        if (local_2e0 != auStack_2d0) {
          operator_delete(local_2e0,auStack_2d0[0] + 1);
        }
        if (local_258 != alStack_248) {
          operator_delete(local_258,alStack_248[0] + 1);
        }
        cv::FileStorage::~FileStorage((FileStorage *)local_1d8);
        if (local_198 != (void *)0x0) {
          operator_delete(local_198,local_188 - (long)local_198);
        }
        if (local_178 != (void *)0x0) {
          operator_delete(local_178,local_168 - (long)local_178);
        }
        cv::Mat::~Mat((Mat *)&local_128);
        cv::Mat::~Mat((Mat *)local_c0);
        std::
        vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
        ::~vector(&local_218);
        std::
        vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
        ::~vector(&local_278);
        if (local_1f8.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_2b8);
        if (local_298 != local_288) {
          operator_delete(local_298,local_288[0] + 1);
        }
        _Unwind_Resume(uVar6);
      }
LAB_00102ae1:
      local_2e0 = auStack_2d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"dis_cef","");
      pFVar5 = (FileStorage *)cv::operator<<((FileStorage *)local_1d8,(string *)&local_2e0);
      if (local_2e0 != auStack_2d0) {
        operator_delete(local_2e0,auStack_2d0[0] + 1);
      }
      cVar3 = (**(code **)(*(long *)pFVar5 + 0x18))(pFVar5);
      if (cVar3 != '\0') {
        if (*(int *)(pFVar5 + 8) == 6) goto LAB_00102dd3;
        cv::write(pFVar5,(string *)(pFVar5 + 0x10),(Mat *)&local_128);
        if (((byte)pFVar5[8] & 4) != 0) {
          *(undefined4 *)(pFVar5 + 8) = 6;
        }
      }
      local_2e0 = auStack_2d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"image_size","");
      pFVar5 = (FileStorage *)cv::operator<<((FileStorage *)local_1d8,(string *)&local_2e0);
      if (local_2e0 != auStack_2d0) {
        operator_delete(local_2e0,auStack_2d0[0] + 1);
      }
      cVar3 = (**(code **)(*(long *)pFVar5 + 0x18))(pFVar5);
      if (cVar3 != '\0') {
        if (*(int *)(pFVar5 + 8) == 6) goto LAB_00102e11;
        local_2d8 = (Mat *)0x0;
        auStack_2d0[0] = auStack_2d0[0] & 0xffffffffffffff00;
        local_2e0 = auStack_2d0;
        cv::internal::WriteStructContext::WriteStructContext
                  ((WriteStructContext *)local_148,pFVar5,(string *)(pFVar5 + 0x10),0xc,
                   (string *)&local_2e0);
        if (local_2e0 != auStack_2d0) {
          operator_delete(local_2e0,auStack_2d0[0] + 1);
        }
        cv::writeScalar(pFVar5,iVar8);
        cv::writeScalar(pFVar5,iVar7);
        cv::internal::WriteStructContext::~WriteStructContext((WriteStructContext *)local_148);
        if (((byte)pFVar5[8] & 4) != 0) {
          *(undefined4 *)(pFVar5 + 8) = 6;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"params written to ",0x12);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_258,(long)local_250);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
    if (local_258 != alStack_248) {
      operator_delete(local_258,alStack_248[0] + 1);
    }
    cv::FileStorage::~FileStorage((FileStorage *)local_1d8);
    if (local_198 != (void *)0x0) {
      operator_delete(local_198,local_188 - (long)local_198);
    }
    if (local_178 != (void *)0x0) {
      operator_delete(local_178,local_168 - (long)local_178);
    }
    cv::Mat::~Mat((Mat *)&local_128);
    cv::Mat::~Mat((Mat *)local_c0);
  }
  std::
  vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
  ::~vector(&local_218);
  std::
  vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  ::~vector(&local_278);
  if (local_1f8.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.
                    super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8.
                          super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.
                          super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_00102d5d:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2b8);
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    cout << "0. Calibrate: input some images then get camera intrinsic params." << endl;

    string fp_images = "../images";
    if (argc > 1)
        fp_images = argv[1];
    cout << "image folder: " << fp_images << endl;

    // find images
    vector<String> fns;
    glob(fp_images + "/*.jpg", fns);
    cout << "num of images: " << fns.size() << endl;
    if (fns.size() < 3) {
        cout << "too few images, abort" << endl;
        return 0;
    }

    // detect points
    const int rows = 6;
    const int cols = 9;
    const float space = 50;
    vector<Point3f> tmp;
    for (int y = 0; y < rows; ++y)
        for (int x = 0; x < cols; ++x)
            tmp.emplace_back(x * space, y * space, 0.f);
    vector<vector<Point2f>> vpts2d;
    vector<vector<Point3f>> vpts3d;
    Size image_size;
    for (const auto& fn : fns) {
        auto image = imread(fn, IMREAD_GRAYSCALE);
        if (image.empty())
            continue;
        image_size = image.size();
        vector<Point2f> pts;
        if (findChessboardCorners(image, { cols, rows }, pts)) {
            vpts2d.push_back(pts);
            vpts3d.push_back(tmp);
        }
    }
    if (vpts2d.size() < 3) {
        cout << "too few valid images, abort" << endl;
        return 0;
    }

    // calibrate
    Mat cam_mtx, dis_cef;
    vector<Vec3d> rvecs, tvecs;
    calibrateCamera(vpts3d, vpts2d, image_size, cam_mtx, dis_cef, rvecs, tvecs);

    // output
    FileStorage fs;
    string fn_params = "params.json";
    if (fs.open(fn_params, FileStorage::WRITE)) {
        fs << "cam_mtx" << cam_mtx;
        fs << "dis_cef" << dis_cef;
        fs << "image_size" << image_size;
        cout << "params written to " << fn_params << endl;
    }

    return 0;
}